

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O0

void Abc_NtkCollectAddOne
               (int iNtk,int iObj,int iGiaLit,Gia_Man_t *pGia,Vec_Int_t *vGia2Cla,Vec_Int_t **vNexts
               )

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int Entry_00;
  Gia_Obj_t *pGVar6;
  int Entry;
  int Added;
  int Compl;
  int iRepr;
  Vec_Int_t **vNexts_local;
  Vec_Int_t *vGia2Cla_local;
  Gia_Man_t *pGia_local;
  int iGiaLit_local;
  int iObj_local;
  int iNtk_local;
  
  iVar1 = Abc_Lit2Var(iGiaLit);
  iVar1 = Gia_ObjReprSelf(pGia,iVar1);
  uVar2 = Abc_LitIsCompl(iGiaLit);
  pGVar6 = Gia_ManObj(pGia,iVar1);
  uVar3 = Gia_ObjPhase(pGVar6);
  iVar4 = Abc_Lit2Var(iGiaLit);
  pGVar6 = Gia_ManObj(pGia,iVar4);
  uVar5 = Gia_ObjPhase(pGVar6);
  iVar4 = Abc_Var2Lit(iObj,uVar2 ^ uVar3 ^ uVar5);
  iVar4 = Abc_Var2Lit(iVar4,iNtk);
  Entry_00 = Vec_IntEntry(vGia2Cla,iVar1);
  Vec_IntWriteEntry(vNexts[iNtk],iObj,Entry_00);
  Vec_IntWriteEntry(vGia2Cla,iVar1,iVar4);
  return;
}

Assistant:

static inline void Abc_NtkCollectAddOne( int iNtk, int iObj, int iGiaLit, Gia_Man_t * pGia, Vec_Int_t * vGia2Cla, Vec_Int_t * vNexts[2] )
{
    int iRepr = Gia_ObjReprSelf( pGia, Abc_Lit2Var(iGiaLit) );
    int Compl = Abc_LitIsCompl(iGiaLit) ^ Gia_ObjPhase(Gia_ManObj(pGia, iRepr)) ^ Gia_ObjPhase(Gia_ManObj(pGia, Abc_Lit2Var(iGiaLit)));
    int Added = Abc_Var2Lit( Abc_Var2Lit(iObj, Compl), iNtk );
    int Entry = Vec_IntEntry( vGia2Cla, iRepr );
    Vec_IntWriteEntry( vNexts[iNtk], iObj, Entry );
    Vec_IntWriteEntry( vGia2Cla, iRepr, Added );
}